

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,UInt u)

{
  StrWriter *this_local;
  UInt u_local;
  
  sprint(&this->ptr,(ulong)u.raw,&this->style->numberFormat);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(UInt u)
{
    sprint(ptr, u.raw, style.numberFormat);
    return *this;
}